

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

trt_node * troc_read_node(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  ushort uVar1;
  ushort uVar2;
  lysc_node *node;
  lys_module *plVar3;
  lysp_node *pn;
  lyplg_ext_sprinter_tree_node_override *plVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  trt_type tVar8;
  trt_iffeatures tVar9;
  
  if ((tc == (trt_tree_ctx *)0x0) || (tc->cn == (lysc_node *)0x0)) {
    __assert_fail("tc && tc->cn",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                  ,0xcf3,
                  "struct trt_node troc_read_node(struct trt_parent_cache, struct trt_tree_ctx *)");
  }
  plVar4 = tro_set_node_overr(tc->lysc_tree,tc->cn,'\x01',&tc->plugin_ctx);
  node = tc->cn;
  (__return_storage_ptr__->name).opts = (char *)0x0;
  (__return_storage_ptr__->name).type = TRD_NODE_ELSE;
  (__return_storage_ptr__->name).keys = '\0';
  *(undefined3 *)&(__return_storage_ptr__->name).field_0x5 = 0;
  (__return_storage_ptr__->name).module_prefix = (char *)0x0;
  (__return_storage_ptr__->name).str = (char *)0x0;
  (__return_storage_ptr__->name).add_opts = (char *)0x0;
  uVar1 = node->flags;
  pcVar6 = "x";
  if ((uVar1 & 8) == 0) {
    pcVar6 = "+";
  }
  pcVar7 = "o";
  if ((uVar1 & 0x10) == 0) {
    pcVar7 = pcVar6;
  }
  __return_storage_ptr__->status = pcVar7;
  uVar2 = node->nodetype;
  if ((plVar4 == (lyplg_ext_sprinter_tree_node_override *)0x0) ||
     (pcVar6 = plVar4->flags, plVar4->flags == (char *)0x0)) {
    if (((uVar2 | uVar1) >> 0xc & 1) == 0) {
      if ((uVar2 & 0x6000) == 0 && (uVar1 & 0x2000) == 0) {
        if ((uVar2 >> 10 & 1) == 0) {
          if ((uVar2 >> 0xb & 1) == 0) {
            if ((uVar2 & 0x300) == 0) {
              pcVar7 = "rw";
              if ((uVar1 & 1) == 0) {
                pcVar7 = "--";
              }
              pcVar6 = "ro";
              if ((uVar1 & 2) == 0) {
                pcVar6 = pcVar7;
              }
            }
            else {
              pcVar6 = "-x";
            }
          }
          else {
            pcVar6 = "-u";
          }
        }
        else {
          pcVar6 = "-n";
        }
      }
      else {
        pcVar6 = "ro";
      }
    }
    else {
      pcVar6 = "-w";
    }
  }
  __return_storage_ptr__->flags = pcVar6;
  if ((uVar2 & 0x3000) != 0) goto LAB_0018e83f;
  if ((char)(byte)uVar2 < '\0') {
    (__return_storage_ptr__->name).type = TRD_NODE_CASE;
    goto LAB_0018e83f;
  }
  if (((uVar1 & 0x20) == 0) && ((uVar2 & 2) != 0)) {
    (__return_storage_ptr__->name).type = TRD_NODE_CHOICE;
LAB_0018e82b:
    pcVar6 = "?";
  }
  else {
    if ((uVar2 & 2) != 0) {
      (__return_storage_ptr__->name).type = TRD_NODE_CHOICE;
      goto LAB_0018e83f;
    }
    if (((char)uVar1 < '\0') && ((uVar2 & 1) != 0)) {
      pcVar6 = "!";
    }
    else {
      if ((uVar2 & 0x18) == 0) {
        if ((((uVar1 & 0x20) != 0) || ((uVar2 & 0x60) == 0)) &&
           (((uVar1 & 0x120) != 0 || ((uVar2 & 4) == 0)))) goto LAB_0018e83f;
        goto LAB_0018e82b;
      }
      pcVar6 = "*";
    }
  }
  (__return_storage_ptr__->name).opts = pcVar6;
LAB_0018e83f:
  if (plVar4 == (lyplg_ext_sprinter_tree_node_override *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = plVar4->add_opts;
  }
  (__return_storage_ptr__->name).add_opts = pcVar6;
  (__return_storage_ptr__->name).keys = (uVar1 >> 9 & 1) == 0 & (byte)uVar2 >> 4;
  plVar3 = node->module;
  if ((tc->cmod == (lysc_module *)0x0 || plVar3 == (lys_module *)0x0) ||
     (plVar3->compiled == tc->cmod)) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = plVar3->prefix;
  }
  (__return_storage_ptr__->name).module_prefix = pcVar6;
  (__return_storage_ptr__->name).str = node->name;
  pn = (lysp_node *)node->priv;
  tVar8 = trop_resolve_type(pn);
  (__return_storage_ptr__->type).type = tVar8.type;
  (__return_storage_ptr__->type).str = tVar8.str;
  tVar9 = trop_resolve_iffeatures(pn);
  (__return_storage_ptr__->iffeatures).type = tVar9.type;
  (__return_storage_ptr__->iffeatures).str = (char *)0x0;
  pvVar5 = tro_next_sibling(node,tc);
  __return_storage_ptr__->last_one = pvVar5 == (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static struct trt_node
troc_read_node(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    (void) ca;
    const struct lysc_node *cn;
    struct trt_node ret;
    struct lyplg_ext_sprinter_tree_node_override *no;

    assert(tc && tc->cn);

    no = tro_set_node_overr(tc->lysc_tree, tc->cn, 1, &tc->plugin_ctx);

    cn = tc->cn;
    ret = TRP_EMPTY_NODE;

    /* <status> */
    ret.status = tro_flags2status(cn->flags);

    /* <flags> */
    ret.flags = troc_resolve_flags(cn->nodetype, cn->flags, no);

    /* set type of the node */
    troc_resolve_node_opts(cn->nodetype, cn->flags, &ret.name.type, &ret.name.opts);
    ret.name.add_opts = no && no->add_opts ? no->add_opts : NULL;
    ret.name.keys = (cn->nodetype & LYS_LIST) && !(cn->flags & LYS_KEYLESS);

    /* <prefix> */
    ret.name.module_prefix = troc_resolve_node_prefix(cn, tc->cmod);

    /* set node's name */
    ret.name.str = cn->name;

    /* <type> */
    ret.type = trop_resolve_type(TRP_TREE_CTX_GET_LYSP_NODE(cn));

    /* <iffeature> */
    ret.iffeatures = trop_resolve_iffeatures(TRP_TREE_CTX_GET_LYSP_NODE(cn));

    ret.last_one = !tro_next_sibling(cn, tc);

    return ret;
}